

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QList<QToolBar_*> *
findChildrenHelper<QToolBar*>(QList<QToolBar_*> *__return_storage_ptr__,QObject *o)

{
  long lVar1;
  QToolBar *t;
  int i;
  ulong uVar2;
  
  lVar1 = *(long *)(o + 8);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QToolBar **)0x0;
  (__return_storage_ptr__->d).size = 0;
  for (uVar2 = 0; uVar2 < *(ulong *)(lVar1 + 0x28); uVar2 = uVar2 + 1) {
    t = QtPrivate::qobject_cast_helper<QToolBar*,QObject>
                  (*(QObject **)(*(long *)(lVar1 + 0x20) + uVar2 * 8));
    if (t != (QToolBar *)0x0) {
      QList<QToolBar_*>::append(__return_storage_ptr__,t);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static QList<T> findChildrenHelper(const QObject *o)
{
    const QObjectList &list = o->children();
    QList<T> result;

    for (int i=0; i < list.size(); ++i) {
        if (T t = qobject_cast<T>(list[i])) {
            result.append(t);
        }
    }

    return result;
}